

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O3

int CsvHelper::read_number(int *number,size_t start,char *buffer,size_t buffer_max)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char text [64];
  char local_68 [72];
  
  if (start < buffer_max) {
    do {
      cVar1 = buffer[start];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        if (cVar1 != '\"') goto LAB_00167fff;
        start = start + 1;
        if (buffer_max <= start) goto LAB_0016802e;
        bVar3 = false;
        iVar6 = -1;
        iVar4 = 0;
        goto LAB_00167fb0;
      }
      start = start + 1;
    } while (buffer_max != start);
    iVar4 = 0;
    uVar7 = buffer_max;
  }
  else {
LAB_00167fff:
    if (start < buffer_max) {
      iVar4 = 0;
      do {
        cVar1 = buffer[start];
        uVar7 = start;
        if ((cVar1 == '\0') || (cVar1 == ',')) break;
        if (iVar4 < 0x3f) {
          local_68[iVar4] = cVar1;
          iVar4 = iVar4 + 1;
        }
        start = start + 1;
        uVar7 = buffer_max;
      } while (buffer_max != start);
    }
    else {
LAB_0016802e:
      iVar4 = 0;
      uVar7 = start;
    }
  }
  goto LAB_00168030;
LAB_00167fb0:
  do {
    cVar1 = buffer[start];
    uVar7 = start;
    if (cVar1 == ',') {
      bVar2 = iVar4 - iVar6 != 3 && bVar3;
      bVar3 = true;
      iVar6 = iVar4;
      if (bVar2) {
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        local_68[lVar5] = ',';
        break;
      }
    }
    else {
      if (cVar1 == '\0') break;
      if (cVar1 == '\"') {
        uVar7 = start + 1;
        break;
      }
      if (iVar4 < 0x3f) {
        local_68[iVar4] = cVar1;
        iVar4 = iVar4 + 1;
      }
    }
    start = start + 1;
    uVar7 = buffer_max;
  } while (start < buffer_max);
LAB_00168030:
  local_68[iVar4] = '\0';
  iVar4 = atoi(local_68);
  *number = iVar4;
  uVar8 = uVar7;
  if (uVar7 < buffer_max) {
    do {
      cVar1 = buffer[uVar7];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        uVar8 = uVar7;
        if (cVar1 == ',') {
          uVar8 = uVar7 + 1;
        }
        break;
      }
      uVar7 = uVar7 + 1;
      uVar8 = buffer_max;
    } while (buffer_max != uVar7);
  }
  return (int)uVar8;
}

Assistant:

int CsvHelper::read_number(int * number, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;
    char text[64];
    int text_max = sizeof(text);
    int has_comma = 0;
    int last_comma_index = -1;


    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, remove the quotes */
    if (start < buffer_max && buffer[start] == '"')
    {
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
                /* Skip the quote and break. */
                start++;
                break;
            }
            else if (buffer[start] == ',')
            {
                /* Skip the comma unless there is a syntax error. */
                if (has_comma != 0)
                {
                    if ((x - last_comma_index) != 3)
                    {
                        text[x++] = ',';
                        break;
                    }
                }

                has_comma = 1;
                last_comma_index = x;
                start++;
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    *number = atoi(text);

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}